

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

Option<Catch::SectionTracking::TestCaseTracker> * __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::operator=
          (Option<Catch::SectionTracking::TestCaseTracker> *this,TestCaseTracker *_value)

{
  Option<Catch::SectionTracking::TestCaseTracker> *in_RDI;
  TestCaseTracker *in_stack_ffffffffffffffd8;
  Option<Catch::SectionTracking::TestCaseTracker> *in_stack_ffffffffffffffe0;
  TestCaseTracker *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  this_00 = (TestCaseTracker *)in_RDI->storage;
  SectionTracking::TestCaseTracker::TestCaseTracker(this_00,in_stack_ffffffffffffffd8);
  in_RDI->nullableValue = this_00;
  return in_RDI;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }